

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# time.cc
# Opt level: O1

int64_t __thiscall absl::ToUnixMicros(absl *this,Time t)

{
  int64_t iVar1;
  long lVar2;
  Duration num;
  Duration local_18;
  
  num._8_8_ = t.rep_.rep_hi_ & 0xffffffff;
  if ((ulong)this >> 0x2b != 0) {
    local_18.rep_hi_ = 0;
    local_18.rep_lo_ = 0;
    num.rep_hi_ = (int64_t)this;
    iVar1 = time_internal::IDivDuration(true,num,(Duration)(ZEXT816(4000) << 0x40),&local_18);
    lVar2 = iVar1 + -1;
    if (-1 < local_18.rep_hi_) {
      lVar2 = iVar1;
    }
    if (0 < iVar1) {
      lVar2 = iVar1;
    }
    return lVar2;
  }
  return num._8_8_ / 4000 + (long)this * 1000000;
}

Assistant:

int64_t ToUnixMicros(Time t) {
  if (time_internal::GetRepHi(time_internal::ToUnixDuration(t)) >= 0 &&
      time_internal::GetRepHi(time_internal::ToUnixDuration(t)) >> 43 == 0) {
    return (time_internal::GetRepHi(time_internal::ToUnixDuration(t)) *
            1000 * 1000) +
           (time_internal::GetRepLo(time_internal::ToUnixDuration(t)) / 4000);
  }
  return FloorToUnit(time_internal::ToUnixDuration(t), absl::Microseconds(1));
}